

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

Gia_Man_t * Bmc_ChainCleanup(Gia_Man_t *p,Vec_Int_t *vOutputs)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  Gia_Man_t *pGVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  if (0 < vOutputs->nSize) {
    lVar4 = 0;
    do {
      uVar6 = vOutputs->pArray[lVar4];
      iVar9 = p->vCos->nSize;
      if (iVar9 - p->nRegs <= (int)uVar6) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = p->vCos->pArray[uVar6];
      lVar7 = (long)(int)uVar6;
      if ((lVar7 < 0) || (p->nObjs <= (int)uVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar2 = *(ulong *)(p->pObjs + lVar7);
      uVar8 = (uint)uVar2;
      uVar10 = uVar6 - (uVar8 & 0x1fffffff);
      if ((int)uVar10 < 0) {
LAB_00527018:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      if ((uVar10 & 0x7fffffff) == 0 && (uVar2 >> 0x1d & 1) == 0) {
        __assert_fail("Gia_ObjFaninLit0p(p, pObj) != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                      ,0x11a,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
      }
      if ((-1 < (int)uVar8) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                      ,0x108,"void Gia_ObjMakePoConst0(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar1 = p->pObjs + lVar7;
      *(ulong *)pGVar1 = uVar2 & 0xffffffffc0000000 | (ulong)(uVar6 & 0x1fffffff);
      pGVar3 = p->pObjs;
      if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar9 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2);
      uVar8 = iVar9 * -0x55555555;
      uVar6 = uVar6 & 0x1fffffff;
      if (uVar6 != uVar8 && SBORROW4(uVar6,uVar8) == (int)(uVar6 + iVar9 * 0x55555555) < 0)
      goto LAB_00527018;
      if (uVar6 != uVar8) {
        __assert_fail("Gia_ObjFaninLit0p(p, pObj) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                      ,0x11c,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vOutputs->nSize);
  }
  pGVar5 = Gia_ManCleanup(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Bmc_ChainCleanup( Gia_Man_t * p, Vec_Int_t * vOutputs )
{
    int i, iOut;
    Vec_IntForEachEntry( vOutputs, iOut, i )
    {
        Gia_Obj_t * pObj = Gia_ManPo( p, iOut );
        assert( Gia_ObjFaninLit0p(p, pObj) != 0 );
        Gia_ObjMakePoConst0( p, pObj );
        assert( Gia_ObjFaninLit0p(p, pObj) == 0 );
    }
    return Gia_ManCleanup( p );
}